

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void exchange_particle_slices
               (int send_left,int send_width,int receive_left,int receive_width,int rank,
               vector<int,_std::allocator<int>_> *particle_numbers,int pn_size,
               vector<particle,_std::allocator<particle>_> *particles,int x_diff)

{
  size_type sVar1;
  reference pvVar2;
  int *piVar3;
  reference pvVar4;
  undefined4 in_R8D;
  vector<int,_std::allocator<int>_> *in_R9;
  undefined4 in_stack_00000008;
  vector<particle,_std::allocator<particle>_> *in_stack_00000010;
  int particles_size;
  int particles_to_receive;
  int particles_to_send;
  undefined8 in_stack_ffffffffffffffa8;
  undefined4 uVar5;
  undefined *__new_size;
  int x_diff_00;
  vector<particle,_std::allocator<particle>_> *in_stack_ffffffffffffffc0;
  vector<particle,_std::allocator<particle>_> *this;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffd0;
  int width;
  int in_stack_ffffffffffffffd4;
  int left;
  int local_28;
  int local_24;
  vector<int,_std::allocator<int>_> *local_20;
  undefined4 local_14;
  
  uVar5 = (undefined4)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  local_20 = in_R9;
  local_14 = in_R8D;
  local_24 = pack_particle_slice(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0,
                                 in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  local_28 = 0;
  __new_size = &ompi_mpi_comm_world;
  this = (vector<particle,_std::allocator<particle>_> *)0x0;
  MPI_Sendrecv(&local_24,1,&ompi_mpi_int,local_14,0,&local_28,1,&ompi_mpi_int,
               CONCAT44(uVar5,local_14),0);
  width = local_28;
  sVar1 = std::vector<particle,_std::allocator<particle>_>::size(in_stack_00000010);
  if ((int)sVar1 < width) {
    std::vector<particle,_std::allocator<particle>_>::resize(this,(size_type)__new_size);
  }
  x_diff_00 = (int)((ulong)__new_size >> 0x20);
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](local_20,0);
  MPI_Sendrecv_replace
            (pvVar2,in_stack_00000008,&ompi_mpi_int,local_14,1,local_14,1,&ompi_mpi_comm_world,0);
  piVar3 = std::max<int>(&local_28,&local_24);
  left = *piVar3;
  pvVar4 = std::vector<particle,_std::allocator<particle>_>::operator[](in_stack_00000010,0);
  MPI_Sendrecv_replace(pvVar4,left,MPI_PARTICLE,local_14,2,local_14,2,&ompi_mpi_comm_world,0);
  unpack_particle_slice(left,width,in_stack_ffffffffffffffc8,this,x_diff_00);
  return;
}

Assistant:

void exchange_particle_slices(int send_left, int send_width, int receive_left, int receive_width, int rank,
        vector<int> & particle_numbers, int pn_size, vector<particle> & particles, int x_diff) {
    int particles_to_send = pack_particle_slice(send_left, send_width, particle_numbers, particles);
    int particles_to_receive = 0;

    MPI_Sendrecv(&particles_to_send, 1, MPI_INT, rank, 0, &particles_to_receive, 1, MPI_INT, rank, 0, MPI_COMM_WORLD,
            MPI_STATUS_IGNORE);

    if (particles_to_receive > static_cast<int>(particles.size())) {
        particles.resize(3 * particles_to_receive / 2 + 1);
    }

    MPI_Sendrecv_replace(&(particle_numbers[0]), pn_size, MPI_INT, rank, 1, rank, 1, MPI_COMM_WORLD,
    MPI_STATUSES_IGNORE);

    int particles_size = max(particles_to_receive, particles_to_send);

    MPI_Sendrecv_replace(&(particles[0]), particles_size, MPI_PARTICLE, rank, 2, rank, 2, MPI_COMM_WORLD,
            MPI_STATUS_IGNORE);

    unpack_particle_slice(receive_left, receive_width, particle_numbers, particles, x_diff);
}